

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_30;
  size_t local_28;
  undefined1 local_20 [16];
  
  (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[4])(&local_30);
  if (local_28 == (this->m_name)._M_string_length) {
    if (local_28 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_30,(this->m_name)._M_dataplus._M_p,local_28);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return bVar2;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return tracker->name() == m_name;
            }